

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,3>,tcu::Matrix<float,4,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,3>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  undefined8 *puVar1;
  bool *pbVar2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pMVar5;
  pointer pMVar6;
  Variable<tcu::Matrix<float,_4,_3>_> *pVVar7;
  pointer pcVar8;
  double dVar9;
  undefined8 uVar10;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar11;
  PrecisionCase *pPVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  Interval *pIVar20;
  IVal *pIVar21;
  MessageBuilder *pMVar22;
  TestError *this_00;
  uint uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  undefined1 *puVar25;
  Matrix<float,_4,_3> *pMVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  IVal in2;
  IVal reference1;
  IVal in3;
  Environment env;
  ostringstream os;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  FuncSet funcs;
  ostringstream oss;
  undefined1 auStack_5d8 [8];
  string local_5d0;
  IVal local_5a9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_5a8;
  IVal *local_5a0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_598;
  size_t local_590;
  Statement *local_588;
  PrecisionCase *local_580;
  string local_578;
  ulong local_558;
  ResultCollector *local_550;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_548;
  undefined1 local_518 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  double local_4f8;
  Data local_4f0;
  undefined4 local_4e0;
  ios_base local_4a8 [8];
  ios_base local_4a0 [264];
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_398;
  FloatFormat local_368;
  undefined1 local_340 [56];
  _Alloc_hider local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [24];
  double local_2a0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_590 = ((long)pMVar6 - (long)pMVar5 >> 4) * -0x5555555555555555;
  local_5a8 = variables;
  local_598 = inputs;
  local_588 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_398,local_590);
  local_308._M_p = (pointer)&local_2f8;
  local_340._0_4_ = GLSL_VERSION_300_ES;
  local_340._8_8_ = (pointer)0x0;
  local_340._16_8_ = (pointer)0x0;
  local_340._24_8_ = (pointer)0x0;
  local_340._32_8_ = (pointer)0x0;
  local_340._40_8_ = (pointer)0x0;
  local_340._48_8_ = (pointer)0x0;
  local_300 = 0;
  local_2f8._M_local_buf[0] = '\0';
  local_2e8._M_p = (pointer)&local_2d8;
  local_2e0 = 0;
  local_2d8._M_local_buf[0] = '\0';
  local_368.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_368.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_368.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_368.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_368.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_368.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_368.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_368.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_368._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_548._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_548._M_impl.super__Rb_tree_header._M_header;
  local_548._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_548._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_548._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_518._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_518 + 8);
  local_548._M_impl.super__Rb_tree_header._M_header._M_right =
       local_548._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  (*local_588->_vptr_Statement[2])(local_588,poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_518,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_4a0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_2c8 + 8);
  local_2c8._8_4_ = _S_red;
  local_2b8._0_8_ = (_Base_ptr)0x0;
  local_2a0 = 0.0;
  local_5a0 = (IVal *)pMVar5;
  local_2b8._8_8_ = p_Var4;
  local_2b8._16_8_ = p_Var4;
  (*local_588->_vptr_Statement[4])(local_588,local_2c8);
  if ((_Rb_tree_node_base *)local_2b8._8_8_ != p_Var4) {
    p_Var15 = (_Rb_tree_node_base *)local_2b8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1a8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var4);
  }
  if (local_2a0 != 0.0) {
    local_518._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_518 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_518,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_4a0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_2c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,"precision ",10);
  pcVar16 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)(auStack_5d8 + *(long *)(local_518._0_8_ + -0x18)) + 0xc0);
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_308,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
  std::ios_base::~ios_base(local_4a8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_340._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar24) {
      local_508._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_508._8_8_ = plVar18[3];
      local_518._0_8_ = &local_508;
    }
    else {
      local_508._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_518._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_518._8_8_ = plVar18[1];
    *plVar18 = (long)paVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_308,(string *)local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._0_8_ != &local_508) {
      operator_delete((void *)local_518._0_8_,local_508._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_340 + 8),2);
  makeSymbol<tcu::Matrix<float,4,3>>
            ((Symbol *)local_518,this,
             (local_5a8->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr);
  uVar10 = local_340._8_8_;
  std::__cxx11::string::operator=((string *)(local_340._8_8_ + 0x38),(string *)local_518);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_4f8);
  glu::VarType::~VarType((VarType *)&local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._0_8_ != &local_508) {
    operator_delete((void *)local_518._0_8_,local_508._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,4,3>>
            ((Symbol *)local_518,this,
             (local_5a8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr);
  uVar10 = local_340._8_8_;
  std::__cxx11::string::operator=((string *)local_340._8_8_,(string *)local_518);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_4f8);
  glu::VarType::~VarType((VarType *)&local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._0_8_ != &local_508) {
    operator_delete((void *)local_518._0_8_,local_508._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_340 + 0x20),1);
  makeSymbol<tcu::Matrix<float,4,3>>
            ((Symbol *)local_518,this,
             (local_5a8->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr);
  uVar10 = local_340._32_8_;
  std::__cxx11::string::operator=((string *)local_340._32_8_,(string *)local_518);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_4f8);
  glu::VarType::~VarType((VarType *)&local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._0_8_ != &local_508) {
    operator_delete((void *)local_518._0_8_,local_508._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
  (*local_588->_vptr_Statement[2])(local_588,local_518);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
  std::ios_base::~ios_base(local_4a8);
  std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar19 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_340)
  ;
  local_518._0_8_ =
       (local_598->in0).
       super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_518._8_8_ =
       (local_598->in1).
       super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_508._M_allocated_capacity =
       (size_type)
       (local_598->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_508._8_8_ =
       (local_598->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_398.out0.
       super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_398.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  pIVar21 = (IVal *)local_1a8;
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_590,local_518);
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_518);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_1a8);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_2c8);
  pVVar11 = local_5a8;
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_548,
             (local_5a8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr,(IVal *)local_518);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_548,
             (pVVar11->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_548,
             (pVVar11->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_5d0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_548,
             (pVVar11->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_578);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_548,
             (pVVar11->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
             .m_ptr,(IVal *)local_2c8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_548,
             (pVVar11->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_5a9);
  local_580 = this;
  if ((IVal *)pMVar6 == local_5a0) {
    local_5a0 = (IVal *)0x0;
  }
  else {
    fmt = &(this->m_ctx).floatFormat;
    local_550 = &this->m_status;
    local_558 = local_590 + (local_590 == 0);
    uVar29 = 0;
    local_5a0 = (IVal *)0x0;
    do {
      tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_1a8);
      if ((uVar29 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_580->super_TestCase).super_TestNode.m_testCtx);
      }
      round<tcu::Matrix<float,4,3>>
                ((IVal *)local_2c8,(BuiltinPrecisionTests *)fmt,
                 (FloatFormat *)
                 ((local_598->in0).
                  super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar29),(Matrix<float,_4,_3> *)pIVar21
                );
      pVVar11 = local_5a8;
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_518,fmt,(IVal *)local_2c8);
      pIVar20 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_548,
                           (pVVar11->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      lVar27 = 0;
      pMVar22 = (MessageBuilder *)local_518;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)((long)&pIVar20->m_hi + lVar28) =
               *(undefined8 *)(&pMVar22->field_0x10 + lVar28);
          puVar1 = (undefined8 *)((long)&pMVar22->m_log + lVar28);
          dVar9 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar28;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar9;
          lVar28 = lVar28 + 0x60;
        } while (lVar28 != 0x120);
        lVar27 = lVar27 + 1;
        pIVar20 = pIVar20 + 1;
        pMVar22 = (MessageBuilder *)&pMVar22->field_0x18;
      } while (lVar27 != 4);
      round<tcu::Matrix<float,4,3>>
                ((IVal *)local_2c8,(BuiltinPrecisionTests *)fmt,
                 (FloatFormat *)
                 ((local_598->in1).
                  super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar29),(Matrix<float,_4,_3> *)pMVar22
                );
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_518,fmt,(IVal *)local_2c8);
      pIVar20 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_548,
                           (pVVar11->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      lVar27 = 0;
      pMVar22 = (MessageBuilder *)local_518;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)((long)&pIVar20->m_hi + lVar28) =
               *(undefined8 *)(&pMVar22->field_0x10 + lVar28);
          puVar1 = (undefined8 *)((long)&pMVar22->m_log + lVar28);
          dVar9 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar28;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar9;
          lVar28 = lVar28 + 0x60;
        } while (lVar28 != 0x120);
        lVar27 = lVar27 + 1;
        pIVar20 = pIVar20 + 1;
        pMVar22 = (MessageBuilder *)&pMVar22->field_0x18;
      } while (lVar27 != 4);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_548,
                 (pVVar11->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_548,
                 (pVVar11->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_4f0.basic.type = (local_580->m_ctx).precision;
      local_4f8 = (this->m_ctx).floatFormat.m_maxValue;
      local_518._0_8_ = *(undefined8 *)fmt;
      local_518._8_8_ = *(undefined8 *)&(this->m_ctx).floatFormat.m_fractionBits;
      local_508._M_allocated_capacity = *(undefined8 *)&(this->m_ctx).floatFormat.m_hasInf;
      local_508._8_8_ = *(undefined8 *)&(this->m_ctx).floatFormat.m_exactPrecision;
      local_4e0 = 0;
      local_4f0._8_8_ = &local_548;
      (*local_588->_vptr_Statement[3])(local_588,(MessageBuilder *)local_518);
      pIVar21 = Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_548,
                           (pVVar11->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_518,&local_368,pIVar21);
      puVar25 = local_1a8;
      lVar27 = 0;
      poVar3 = (ostringstream *)(local_518 + 8);
      pMVar22 = (MessageBuilder *)local_518;
      do {
        lVar28 = 0;
        do {
          *(undefined8 *)(puVar25 + lVar28 + 0x10) = *(undefined8 *)(&pMVar22->field_0x10 + lVar28);
          puVar1 = (undefined8 *)((long)&pMVar22->m_log + lVar28);
          uVar10 = puVar1[1];
          *(undefined8 *)(puVar25 + lVar28) = *puVar1;
          *(undefined8 *)((long)(puVar25 + lVar28) + 8) = uVar10;
          lVar28 = lVar28 + 0x60;
        } while (lVar28 != 0x120);
        lVar27 = lVar27 + 1;
        puVar25 = puVar25 + 0x18;
        pMVar22 = (MessageBuilder *)&pMVar22->field_0x18;
      } while (lVar27 != 4);
      bVar13 = contains<tcu::Matrix<float,4,3>>
                         ((IVal *)local_1a8,
                          local_398.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar29);
      local_518._0_8_ = &local_508;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_518,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_550,bVar13,(string *)local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._0_8_ != &local_508) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508._M_allocated_capacity + 1));
      }
      uVar23 = (int)local_5a0 + ((byte)~bVar13 & 1);
      pIVar21 = (IVal *)(ulong)uVar23;
      local_5a0 = pIVar21;
      if ((int)uVar23 < 0x65 && !bVar13) {
        local_518._0_8_ = ((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar16 = "Failed";
        if (bVar13) {
          pcVar16 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar16,6);
        pVVar11 = local_5a8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar7 = (pVVar11->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                 .m_ptr;
        pMVar26 = (Matrix<float,_4,_3> *)local_2b8;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_2c8._0_8_ = pMVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_2c8._0_8_,
                   CONCAT44(local_2c8._12_4_,local_2c8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_5d0,(BuiltinPrecisionTests *)&local_368,
                   (FloatFormat *)
                   ((local_598->in0).
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar29),pMVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_3> *)local_2c8._0_8_ != (Matrix<float,_4,_3> *)local_2b8) {
          operator_delete((void *)local_2c8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_2b8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar7 = (pVVar11->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                 .m_ptr;
        pMVar26 = (Matrix<float,_4,_3> *)local_2b8;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_2c8._0_8_ = pMVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_2c8._0_8_,
                   CONCAT44(local_2c8._12_4_,local_2c8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_5d0,(BuiltinPrecisionTests *)&local_368,
                   (FloatFormat *)
                   ((local_598->in1).
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar29),pMVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_3> *)local_2c8._0_8_ != (Matrix<float,_4,_3> *)local_2b8) {
          operator_delete((void *)local_2c8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_2b8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar7 = (pVVar11->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_3>_>_>
                 .m_ptr;
        pIVar21 = (IVal *)local_2b8;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_2c8._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_2c8._0_8_,
                   CONCAT44(local_2c8._12_4_,local_2c8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  (&local_5d0,(BuiltinPrecisionTests *)&local_368,
                   (FloatFormat *)
                   (local_398.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar29),
                   (Matrix<float,_4,_3> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,3>>
                  (&local_578,(BuiltinPrecisionTests *)&local_368,(FloatFormat *)local_1a8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_578._M_dataplus._M_p,local_578._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_2c8._0_8_ != (IVal *)local_2b8) {
          operator_delete((void *)local_2c8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_2b8._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_518,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_4a0);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != local_558);
  }
  pPVar12 = local_580;
  iVar14 = (int)local_5a0;
  if (100 < iVar14) {
    local_518._0_8_ = ((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_518 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar14 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_518,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_4a0);
  }
  if (iVar14 == 0) {
    local_518._0_8_ = ((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_518 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_518,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_518._0_8_ = ((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_518 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_518,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_518 + 8));
  std::ios_base::~ios_base(local_4a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_548);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_p != &local_2d8) {
    operator_delete(local_2e8._M_p,
                    CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_p != &local_2f8) {
    operator_delete(local_308._M_p,
                    CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_340 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_340 + 8));
  if (local_398.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398.out0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}